

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,SizedPtr mem,ThreadSafeArena *parent)

{
  ArenaBlock *this_00;
  __pointer_type pcVar1;
  bool bVar2;
  char *pcVar3;
  ArenaBlock *this_01;
  char *pcVar4;
  ThreadSafeArena *pTVar5;
  undefined1 *min_bytes;
  size_t last_size;
  SerialArena *this_02;
  undefined8 unaff_R12;
  SerialArena *unaff_R14;
  SerialArena *unaff_R15;
  SizedPtr SVar6;
  SerialArena *pSStack_70;
  LogMessageFatal aLStack_68 [16];
  ThreadSafeArena *pTStack_58;
  undefined8 uStack_50;
  SerialArena *pSStack_48;
  SerialArena *pSStack_40;
  
  pTVar5 = (ThreadSafeArena *)mem.n;
  if (mem.p < (void *)0x88) {
    min_bytes = &stack0xffffffffffffffd0;
    pSStack_40 = (SerialArena *)0x1c9356;
    New();
  }
  else {
    unaff_R12 = 0;
    pSStack_40 = (SerialArena *)0x1c92c1;
    ArenaBlock::ArenaBlock((ArenaBlock *)this,(ArenaBlock *)0x0,(size_t)mem.p);
    pSStack_40 = (SerialArena *)0x1c92ce;
    unaff_R15 = (SerialArena *)ArenaBlock::Pointer((ArenaBlock *)this,0x10);
    pSStack_40 = (SerialArena *)0x1c92de;
    pcVar3 = ArenaBlock::Pointer((ArenaBlock *)this,0x88);
    (unaff_R15->ptr_)._M_b._M_p = pcVar3;
    pSStack_40 = (SerialArena *)0x1c92f1;
    pcVar3 = ArenaBlock::Pointer((ArenaBlock *)this,(ulong)this->limit_ & 0xfffffffffffffff8);
    unaff_R15->limit_ = pcVar3;
    min_bytes = (undefined1 *)0x88;
    pSStack_40 = (SerialArena *)0x1c9302;
    pcVar3 = ArenaBlock::Pointer((ArenaBlock *)this,0x88);
    unaff_R15->prefetch_ptr_ = pcVar3;
    (unaff_R15->cleanup_list_).head_ = (Chunk *)0x0;
    (unaff_R15->cleanup_list_).next_ = (CleanupNode *)0x0;
    (unaff_R15->cleanup_list_).limit_ = (CleanupNode *)0x0;
    (unaff_R15->cleanup_list_).prefetch_ptr_ = (char *)0x0;
    (unaff_R15->string_block_)._M_b._M_p = (__pointer_type)0x0;
    (unaff_R15->string_block_unused_).super___atomic_base<unsigned_long>._M_i = 0;
    (unaff_R15->head_)._M_b._M_p = (__pointer_type)this;
    (unaff_R15->space_used_).super___atomic_base<unsigned_long>._M_i = 0;
    pcVar3 = this->limit_;
    (unaff_R15->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict3)pcVar3;
    unaff_R15->parent_ = pTVar5;
    unaff_R15->cached_block_length_ = '\0';
    unaff_R15->cached_blocks_ = (CachedBlock **)0x0;
    unaff_R14 = this;
    if (pcVar3 != (char *)0x0) {
      return unaff_R15;
    }
  }
  this_02 = (SerialArena *)&stack0xffffffffffffffd0;
  pSStack_40 = (SerialArena *)AllocateAlignedFallback;
  New(this_02);
  this_00 = (this_02->head_)._M_b._M_p;
  pTStack_58 = pTVar5;
  uStack_50 = unaff_R12;
  pSStack_48 = unaff_R14;
  pSStack_40 = unaff_R15;
  if (this_00->size == 0) {
    last_size = 0;
  }
  else {
    pcVar1 = (this_02->ptr_)._M_b._M_p;
    pcVar3 = ArenaBlock::Pointer(this_00,0x10);
    (this_02->space_used_).super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict3)
         (pcVar1 + ((this_02->space_used_).super___atomic_base<unsigned_long>._M_i - (long)pcVar3));
    last_size = this_00->size;
  }
  SVar6 = anon_unknown_12::AllocateBlock
                    ((AllocationPolicy *)
                     ((this_02->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8),last_size,
                     (size_t)min_bytes);
  this_01 = (ArenaBlock *)SVar6.p;
  (this_02->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this_02->space_allocated_).super___atomic_base<unsigned_long>._M_i + SVar6.n;
  ArenaBlock::ArenaBlock(this_01,this_00,SVar6.n);
  pcVar3 = ArenaBlock::Pointer(this_01,0x10);
  pcVar4 = ArenaBlock::Pointer(this_01,this_01->size & 0xfffffffffffffff8);
  (this_02->ptr_)._M_b._M_p = pcVar3;
  this_02->prefetch_ptr_ = pcVar3;
  this_02->limit_ = pcVar4;
  (this_02->head_)._M_b._M_p = this_01;
  pSStack_70 = (SerialArena *)0x0;
  bVar2 = MaybeAllocateAligned(this_02,(size_t)min_bytes,&pSStack_70);
  if (bVar2) {
    return pSStack_70;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_68,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x114,3,"res");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_68);
}

Assistant:

SerialArena* SerialArena::New(SizedPtr mem, ThreadSafeArena& parent) {
  ABSL_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent.arena_stats_.MutableStats(),
                                            /*used=*/0, /*allocated=*/mem.n,
                                            /*wasted=*/0);
  auto b = new (mem.p) ArenaBlock{nullptr, mem.n};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, parent);
}